

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalextract.h
# Opt level: O0

unsigned_long __thiscall
hbm::streaming::extract<unsigned_long,_(hbm::streaming::endian)0>::operator()
          (extract<unsigned_long,_(hbm::streaming::endian)0> *this,uchar **p)

{
  uint64_t uVar1;
  long *in_RSI;
  unsigned_long value;
  swap_impl<8UL,_(hbm::streaming::endian)0> swapper;
  copy_type temp;
  
  uVar1 = swap_impl<8UL,_(hbm::streaming::endian)0>::swap(0x1417a8);
  *in_RSI = *in_RSI + 8;
  return uVar1;
}

Assistant:

inline RET operator()(unsigned char **p) const
			{
				typename copy_traits<RET>::copy_type temp;
				std::memcpy(&temp, *p, sizeof(temp));
				swap_impl<sizeof(temp), e> swapper;
				temp = swapper.swap(temp);
				RET value;
				std::memcpy(&value, &temp, sizeof(value));
				*p = (*p) + sizeof(RET);
				return value;
			}